

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O3

void duckdb::UnaryExecutor::
     ExecuteFlat<double,duckdb::string_t,duckdb::GenericUnaryWrapper,duckdb::VectorTryCastStringOperator<duckdb::TryCastToVarInt>>
               (double *ldata,string_t *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  anon_struct_16_3_d7536bce_for_pointer *paVar1;
  unsigned_long *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  ulong uVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  ulong uVar6;
  TemplatedValidityData<unsigned_long> *pTVar7;
  undefined8 uVar8;
  char **ppcVar9;
  idx_t iVar10;
  ulong uVar11;
  ulong uVar12;
  string_t sVar13;
  ulong local_70;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  idx_t local_38;
  
  puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar2 == (unsigned_long *)0x0) {
    if (count != 0) {
      ppcVar9 = &(result_data->value).pointer.ptr;
      iVar10 = 0;
      do {
        sVar13 = VectorTryCastStringOperator<duckdb::TryCastToVarInt>::
                 Operation<double,duckdb::string_t>(ldata[iVar10],result_mask,iVar10,dataptr);
        uVar8 = sVar13.value._0_8_;
        paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar9 + -1);
        paVar1->length = (int)uVar8;
        paVar1->prefix[0] = (char)((ulong)uVar8 >> 0x20);
        paVar1->prefix[1] = (char)((ulong)uVar8 >> 0x28);
        paVar1->prefix[2] = (char)((ulong)uVar8 >> 0x30);
        paVar1->prefix[3] = (char)((ulong)uVar8 >> 0x38);
        *ppcVar9 = sVar13.value._8_8_;
        iVar10 = iVar10 + 1;
        ppcVar9 = ppcVar9 + 2;
      } while (count != iVar10);
    }
  }
  else {
    if (adds_nulls) {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
      local_38 = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_48,(unsigned_long **)mask,&local_38);
      p_Var5 = p_Stack_40;
      peVar4 = local_48;
      local_48 = (element_type *)0x0;
      p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar4;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var5;
      if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
         p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
      }
      pTVar7 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar7->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    else {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = puVar2;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data,
                 &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity =
           (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
    }
    if (0x3f < count + 0x3f) {
      iVar10 = 0;
      local_70 = 0;
      do {
        puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          uVar11 = iVar10 + 0x40;
          if (count <= iVar10 + 0x40) {
            uVar11 = count;
          }
LAB_008e6f06:
          uVar6 = iVar10;
          if (iVar10 < uVar11) {
            ppcVar9 = &result_data[iVar10].value.pointer.ptr;
            do {
              sVar13 = VectorTryCastStringOperator<duckdb::TryCastToVarInt>::
                       Operation<double,duckdb::string_t>(ldata[iVar10],result_mask,iVar10,dataptr);
              uVar8 = sVar13.value._0_8_;
              paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar9 + -1);
              paVar1->length = (int)uVar8;
              paVar1->prefix[0] = (char)((ulong)uVar8 >> 0x20);
              paVar1->prefix[1] = (char)((ulong)uVar8 >> 0x28);
              paVar1->prefix[2] = (char)((ulong)uVar8 >> 0x30);
              paVar1->prefix[3] = (char)((ulong)uVar8 >> 0x38);
              *ppcVar9 = sVar13.value._8_8_;
              iVar10 = iVar10 + 1;
              ppcVar9 = ppcVar9 + 2;
              uVar6 = uVar11;
            } while (uVar11 != iVar10);
          }
        }
        else {
          uVar3 = puVar2[local_70];
          uVar11 = iVar10 + 0x40;
          if (count <= iVar10 + 0x40) {
            uVar11 = count;
          }
          uVar6 = uVar11;
          if (uVar3 != 0) {
            if (uVar3 == 0xffffffffffffffff) goto LAB_008e6f06;
            uVar6 = iVar10;
            if (iVar10 < uVar11) {
              ppcVar9 = &result_data[iVar10].value.pointer.ptr;
              uVar12 = 0;
              do {
                if ((uVar3 >> (uVar12 & 0x3f) & 1) != 0) {
                  sVar13 = VectorTryCastStringOperator<duckdb::TryCastToVarInt>::
                           Operation<double,duckdb::string_t>
                                     (ldata[iVar10 + uVar12],result_mask,uVar12 + iVar10,dataptr);
                  uVar8 = sVar13.value._0_8_;
                  paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar9 + -1);
                  paVar1->length = (int)uVar8;
                  paVar1->prefix[0] = (char)((ulong)uVar8 >> 0x20);
                  paVar1->prefix[1] = (char)((ulong)uVar8 >> 0x28);
                  paVar1->prefix[2] = (char)((ulong)uVar8 >> 0x30);
                  paVar1->prefix[3] = (char)((ulong)uVar8 >> 0x38);
                  *ppcVar9 = sVar13.value._8_8_;
                }
                uVar12 = uVar12 + 1;
                ppcVar9 = ppcVar9 + 2;
                uVar6 = uVar11;
              } while (uVar11 - iVar10 != uVar12);
            }
          }
        }
        iVar10 = uVar6;
        local_70 = local_70 + 1;
      } while (local_70 != count + 0x3f >> 6);
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}